

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O1

void LispStringToCStr(LispPTR lispstring,char *cstring)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  DLword *pDVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)lispstring;
  if ((lispstring & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
  }
  pDVar4 = Lisp_world;
  uVar2 = *(uint *)(Lisp_world + uVar5 + 4);
  if ((char)Lisp_world[uVar5 + 3] == 'D') {
    uVar3 = uVar2 * 2;
    if (0 < (int)uVar2) {
      uVar2 = *(uint *)(Lisp_world + uVar5);
      uVar1 = Lisp_world[uVar5 + 2];
      uVar5 = 1;
      if (1 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      uVar6 = 0;
      do {
        cstring[uVar6] =
             *(char *)((long)pDVar4 + uVar6 + (ulong)uVar1 * 2 + (ulong)(uVar2 & 0xfffffff) * 2);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    cstring[(int)uVar3] = '\0';
  }
  else {
    if ((char)Lisp_world[uVar5 + 3] != 'C') {
      error("Arg not Lisp string.\n");
      return;
    }
    if (0 < (int)uVar2) {
      uVar3 = *(uint *)(Lisp_world + uVar5);
      uVar1 = Lisp_world[uVar5 + 2];
      uVar5 = 0;
      do {
        cstring[uVar5] =
             *(char *)((long)pDVar4 + uVar5 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2);
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    cstring[(int)uVar2] = '\0';
  }
  return;
}

Assistant:

void LispStringToCStr(LispPTR lispstring, char *cstring) {
  OneDArray *arrayp;
  char *base;
  short *sbase;
  int i, Len;

  arrayp = (OneDArray *)(NativeAligned4FromLAddr(lispstring));
  Len = arrayp->fillpointer;

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      for (i = 0; i < Len; i++) cstring[i] = base[i];
      cstring[Len] = '\0';
      break;

    case FAT_CHAR_TYPENUMBER:
      sbase = ((short *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      base = (char *)sbase;
      for (i = 0; i < Len * 2; i++) cstring[i] = base[i];
      cstring[Len * 2] = '\0';
      break;

    default: error("Arg not Lisp string.\n");
  }
}